

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O0

int add_attribute_string(stack_st_X509_ATTRIBUTE *attrs,int nid,char *buffer)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  ASN1_STRING *str;
  size_t sVar4;
  X509_ATTRIBUTE *ptr;
  OPENSSL_STACK *pOVar5;
  X509_ATTRIBUTE *pXVar6;
  int c;
  X509_ATTRIBUTE *x509_a;
  ASN1_STRING *asn1_string;
  char *buffer_local;
  int nid_local;
  stack_st_X509_ATTRIBUTE *attrs_local;
  
  pcVar1 = pname;
  if (d_flag != 0) {
    pcVar3 = OBJ_nid2sn(nid);
    printf("%s: adding string attribute %s\n",pcVar1,pcVar3);
  }
  str = ASN1_STRING_new();
  sVar4 = strlen(buffer);
  iVar2 = ASN1_STRING_set(str,buffer,(int)sVar4);
  if (iVar2 < 1) {
    fprintf(_stderr,"%s: error adding data to ASN.1 string\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  ptr = X509_ATTRIBUTE_create(nid,0x13,str);
  pOVar5 = ossl_check_X509_ATTRIBUTE_sk_type(attrs);
  pXVar6 = ossl_check_X509_ATTRIBUTE_type((X509_ATTRIBUTE *)ptr);
  OPENSSL_sk_push(pOVar5,pXVar6);
  return 0;
}

Assistant:

int add_attribute_string(STACK_OF(X509_ATTRIBUTE) *attrs, int nid, char *buffer){
	ASN1_STRING     *asn1_string = NULL;
	X509_ATTRIBUTE  *x509_a;
	int		c;

	if (d_flag)
		printf("%s: adding string attribute %s\n", pname,
			OBJ_nid2sn(nid));

	asn1_string = ASN1_STRING_new();
	if ((c = ASN1_STRING_set(asn1_string, buffer, strlen(buffer))) <= 0) {
		fprintf(stderr, "%s: error adding data to ASN.1 string\n",
			pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_PRINTABLESTRING,
		asn1_string);
	sk_X509_ATTRIBUTE_push(attrs, x509_a);
	return (0);

}